

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ansicolor_sink-inl.h
# Opt level: O2

void __thiscall
spdlog::sinks::ansicolor_sink<spdlog::details::console_mutex>::set_color
          (ansicolor_sink<spdlog::details::console_mutex> *this,level_enum color_level,
          string_view_t color)

{
  pthread_mutex_t *__mutex;
  string_view_t *sv;
  string local_50;
  _func_int **local_30;
  size_t local_28;
  
  local_28 = color.size_;
  local_30 = (_func_int **)color.data_;
  __mutex = (pthread_mutex_t *)this->mutex_;
  std::mutex::lock((mutex *)&__mutex->__data);
  to_string__abi_cxx11_
            (&local_50,(ansicolor_sink<spdlog::details::console_mutex> *)&stack0xffffffffffffffd0,sv
            );
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((this->colors_)._M_elems + color_level,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  pthread_mutex_unlock(__mutex);
  return;
}

Assistant:

SPDLOG_INLINE void ansicolor_sink<ConsoleMutex>::set_color(level::level_enum color_level, string_view_t color)
{
    std::lock_guard<mutex_t> lock(mutex_);
    colors_[color_level] = to_string_(color);
}